

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompositeEvaluationTest.cpp
# Opt level: O3

int main(int param_1,char **param_2)

{
  undefined8 *puVar1;
  long *plVar2;
  undefined8 *puVar3;
  ostream *poVar4;
  ulong *puVar5;
  long *plVar6;
  ulong uVar7;
  undefined8 uVar8;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  Variable x;
  Variable y;
  undefined8 *local_1b0;
  undefined8 local_1a8;
  undefined8 local_1a0;
  undefined8 uStack_198;
  undefined8 *local_190;
  undefined8 local_188;
  undefined8 local_180;
  undefined8 uStack_178;
  ulong *local_170;
  long local_168;
  ulong local_160;
  long lStack_158;
  ulong *local_150;
  long local_148;
  ulong local_140;
  long lStack_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  Variable local_f0;
  Expression local_d8;
  Expression local_c0;
  Variable local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  long *local_50;
  long local_48;
  long local_40;
  long lStack_38;
  
  local_190 = (undefined8 *)0x0;
  local_f0._vptr_Variable = (_func_int **)&PTR_differentiate_00110c30;
  local_f0.m_variableExpressionPtr.
  super___shared_ptr<Kandinsky::VariableExpression,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<Kandinsky::VariableExpression,std::allocator<Kandinsky::VariableExpression>,double&>
            (&local_f0.m_variableExpressionPtr.
              super___shared_ptr<Kandinsky::VariableExpression,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,(VariableExpression **)&local_f0.m_variableExpressionPtr,
             (allocator<Kandinsky::VariableExpression> *)&local_170,(double *)&local_190);
  local_190 = (undefined8 *)0x0;
  local_a8._vptr_Variable = (_func_int **)&PTR_differentiate_00110c30;
  local_a8.m_variableExpressionPtr.
  super___shared_ptr<Kandinsky::VariableExpression,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<Kandinsky::VariableExpression,std::allocator<Kandinsky::VariableExpression>,double&>
            (&local_a8.m_variableExpressionPtr.
              super___shared_ptr<Kandinsky::VariableExpression,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,(VariableExpression **)&local_a8.m_variableExpressionPtr,
             (allocator<Kandinsky::VariableExpression> *)&local_170,(double *)&local_190);
  (local_f0.m_variableExpressionPtr.
   super___shared_ptr<Kandinsky::VariableExpression,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->m_value =
       3.0;
  (local_a8.m_variableExpressionPtr.
   super___shared_ptr<Kandinsky::VariableExpression,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->m_value =
       2.0;
  Kandinsky::operator+<Kandinsky::Variable,_Kandinsky::Variable,_nullptr>
            (&local_d8,&local_f0,&local_a8);
  Kandinsky::operator*<Kandinsky::Variable,_Kandinsky::Expression,_nullptr>
            (&local_c0,&local_f0,&local_d8);
  (**(local_c0.m_baseExpressionPtr.
      super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
     _vptr_BaseExpression)();
  (**((local_f0.m_variableExpressionPtr.
       super___shared_ptr<Kandinsky::VariableExpression,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
     super_BaseExpression)._vptr_BaseExpression)();
  __gnu_cxx::__to_xstring<std::__cxx11::string,char>(&local_90,vsnprintf,0x148,"%f");
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_90);
  puVar5 = (ulong *)(plVar2 + 2);
  if ((ulong *)*plVar2 == puVar5) {
    local_140 = *puVar5;
    lStack_138 = plVar2[3];
    local_150 = &local_140;
  }
  else {
    local_140 = *puVar5;
    local_150 = (ulong *)*plVar2;
  }
  local_148 = plVar2[1];
  *plVar2 = (long)puVar5;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  (**((local_f0.m_variableExpressionPtr.
       super___shared_ptr<Kandinsky::VariableExpression,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
     super_BaseExpression)._vptr_BaseExpression)();
  __gnu_cxx::__to_xstring<std::__cxx11::string,char>(&local_110,vsnprintf,0x148,"%f");
  uVar7 = 0xf;
  if (local_150 != &local_140) {
    uVar7 = local_140;
  }
  if (uVar7 < local_110._M_string_length + local_148) {
    uVar8 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != &local_110.field_2) {
      uVar8 = local_110.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar8 < local_110._M_string_length + local_148) goto LAB_0010852b;
    puVar3 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_110,0,(char *)0x0,(ulong)local_150);
  }
  else {
LAB_0010852b:
    puVar3 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_150,(ulong)local_110._M_dataplus._M_p);
  }
  local_1b0 = &local_1a0;
  puVar1 = puVar3 + 2;
  if ((undefined8 *)*puVar3 == puVar1) {
    local_1a0 = *puVar1;
    uStack_198 = puVar3[3];
  }
  else {
    local_1a0 = *puVar1;
    local_1b0 = (undefined8 *)*puVar3;
  }
  local_1a8 = puVar3[1];
  *puVar3 = puVar1;
  puVar3[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_1b0);
  puVar5 = (ulong *)(plVar2 + 2);
  if ((ulong *)*plVar2 == puVar5) {
    local_160 = *puVar5;
    lStack_158 = plVar2[3];
    local_170 = &local_160;
  }
  else {
    local_160 = *puVar5;
    local_170 = (ulong *)*plVar2;
  }
  local_168 = plVar2[1];
  *plVar2 = (long)puVar5;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  (**((local_a8.m_variableExpressionPtr.
       super___shared_ptr<Kandinsky::VariableExpression,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
     super_BaseExpression)._vptr_BaseExpression)();
  __gnu_cxx::__to_xstring<std::__cxx11::string,char>(&local_130,vsnprintf,0x148,"%f");
  uVar7 = 0xf;
  if (local_170 != &local_160) {
    uVar7 = local_160;
  }
  if (uVar7 < local_130._M_string_length + local_168) {
    uVar8 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130._M_dataplus._M_p != &local_130.field_2) {
      uVar8 = local_130.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar8 < local_130._M_string_length + local_168) goto LAB_0010866c;
    puVar3 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_130,0,(char *)0x0,(ulong)local_170);
  }
  else {
LAB_0010866c:
    puVar3 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_170,(ulong)local_130._M_dataplus._M_p);
  }
  local_190 = &local_180;
  puVar1 = puVar3 + 2;
  if ((undefined8 *)*puVar3 == puVar1) {
    local_180 = *puVar1;
    uStack_178 = puVar3[3];
  }
  else {
    local_180 = *puVar1;
    local_190 = (undefined8 *)*puVar3;
  }
  local_188 = puVar3[1];
  *puVar3 = puVar1;
  puVar3[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_190);
  plVar6 = plVar2 + 2;
  if ((long *)*plVar2 == plVar6) {
    local_40 = *plVar6;
    lStack_38 = plVar2[3];
    local_50 = &local_40;
  }
  else {
    local_40 = *plVar6;
    local_50 = (long *)*plVar2;
  }
  local_48 = plVar2[1];
  *plVar2 = (long)plVar6;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  if ((extraout_XMM0_Qa != 15.0) || (NAN(extraout_XMM0_Qa))) {
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(char *)local_50,local_48);
    std::endl<char,std::char_traits<char>>(poVar4);
    goto LAB_00108cee;
  }
  if (local_50 != &local_40) {
    operator_delete(local_50);
  }
  if (local_190 != &local_180) {
    operator_delete(local_190);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._M_dataplus._M_p != &local_130.field_2) {
    operator_delete(local_130._M_dataplus._M_p);
  }
  if (local_170 != &local_160) {
    operator_delete(local_170);
  }
  if (local_1b0 != &local_1a0) {
    operator_delete(local_1b0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != &local_110.field_2) {
    operator_delete(local_110._M_dataplus._M_p);
  }
  if (local_150 != &local_140) {
    operator_delete(local_150);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  local_c0._vptr_Expression = (_func_int **)&PTR_variables_00110c58;
  if (local_c0.m_baseExpressionPtr.
      super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_c0.m_baseExpressionPtr.
               super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi);
  }
  local_d8._vptr_Expression = (_func_int **)&PTR_variables_00110c58;
  if (local_d8.m_baseExpressionPtr.
      super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_d8.m_baseExpressionPtr.
               super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi);
  }
  Kandinsky::operator*<Kandinsky::Variable,_Kandinsky::Variable,_nullptr>
            (&local_d8,&local_f0,&local_f0);
  Kandinsky::operator+<Kandinsky::Expression,_Kandinsky::Variable,_nullptr>
            (&local_c0,&local_d8,&local_a8);
  (**(local_c0.m_baseExpressionPtr.
      super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
     _vptr_BaseExpression)();
  (**((local_f0.m_variableExpressionPtr.
       super___shared_ptr<Kandinsky::VariableExpression,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
     super_BaseExpression)._vptr_BaseExpression)();
  __gnu_cxx::__to_xstring<std::__cxx11::string,char>(&local_90,vsnprintf,0x148,"%f");
  puVar3 = (undefined8 *)std::__cxx11::string::append((char *)&local_90);
  puVar5 = puVar3 + 2;
  if ((ulong *)*puVar3 == puVar5) {
    local_140 = *puVar5;
    lStack_138 = puVar3[3];
    local_150 = &local_140;
  }
  else {
    local_140 = *puVar5;
    local_150 = (ulong *)*puVar3;
  }
  local_148 = puVar3[1];
  *puVar3 = puVar5;
  puVar3[1] = 0;
  *(undefined1 *)(puVar3 + 2) = 0;
  (**((local_f0.m_variableExpressionPtr.
       super___shared_ptr<Kandinsky::VariableExpression,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
     super_BaseExpression)._vptr_BaseExpression)();
  __gnu_cxx::__to_xstring<std::__cxx11::string,char>(&local_110,vsnprintf,0x148,"%f");
  uVar7 = 0xf;
  if (local_150 != &local_140) {
    uVar7 = local_140;
  }
  if (uVar7 < local_110._M_string_length + local_148) {
    uVar8 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != &local_110.field_2) {
      uVar8 = local_110.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar8 < local_110._M_string_length + local_148) goto LAB_00108977;
    puVar3 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_110,0,(char *)0x0,(ulong)local_150);
  }
  else {
LAB_00108977:
    puVar3 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_150,(ulong)local_110._M_dataplus._M_p);
  }
  local_1b0 = &local_1a0;
  puVar1 = puVar3 + 2;
  if ((undefined8 *)*puVar3 == puVar1) {
    local_1a0 = *puVar1;
    uStack_198 = puVar3[3];
  }
  else {
    local_1a0 = *puVar1;
    local_1b0 = (undefined8 *)*puVar3;
  }
  local_1a8 = puVar3[1];
  *puVar3 = puVar1;
  puVar3[1] = 0;
  *(undefined1 *)puVar1 = 0;
  puVar3 = (undefined8 *)std::__cxx11::string::append((char *)&local_1b0);
  puVar5 = puVar3 + 2;
  if ((ulong *)*puVar3 == puVar5) {
    local_160 = *puVar5;
    lStack_158 = puVar3[3];
    local_170 = &local_160;
  }
  else {
    local_160 = *puVar5;
    local_170 = (ulong *)*puVar3;
  }
  local_168 = puVar3[1];
  *puVar3 = puVar5;
  puVar3[1] = 0;
  *(undefined1 *)(puVar3 + 2) = 0;
  (**((local_a8.m_variableExpressionPtr.
       super___shared_ptr<Kandinsky::VariableExpression,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
     super_BaseExpression)._vptr_BaseExpression)();
  __gnu_cxx::__to_xstring<std::__cxx11::string,char>(&local_130,vsnprintf,0x148,"%f");
  uVar7 = 0xf;
  if (local_170 != &local_160) {
    uVar7 = local_160;
  }
  if (uVar7 < local_130._M_string_length + local_168) {
    uVar8 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130._M_dataplus._M_p != &local_130.field_2) {
      uVar8 = local_130.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar8 < local_130._M_string_length + local_168) goto LAB_00108ab4;
    puVar3 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_130,0,(char *)0x0,(ulong)local_170);
  }
  else {
LAB_00108ab4:
    puVar3 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_170,(ulong)local_130._M_dataplus._M_p);
  }
  puVar1 = puVar3 + 2;
  if ((undefined8 *)*puVar3 == puVar1) {
    local_180 = *puVar1;
    uStack_178 = puVar3[3];
    local_190 = &local_180;
  }
  else {
    local_180 = *puVar1;
    local_190 = (undefined8 *)*puVar3;
  }
  local_188 = puVar3[1];
  *puVar3 = puVar1;
  puVar3[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_190);
  plVar6 = plVar2 + 2;
  if ((long *)*plVar2 == plVar6) {
    local_60 = *plVar6;
    lStack_58 = plVar2[3];
    local_70 = &local_60;
  }
  else {
    local_60 = *plVar6;
    local_70 = (long *)*plVar2;
  }
  local_68 = plVar2[1];
  *plVar2 = (long)plVar6;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  if ((extraout_XMM0_Qa_00 == 11.0) && (!NAN(extraout_XMM0_Qa_00))) {
    if (local_70 != &local_60) {
      operator_delete(local_70);
    }
    if (local_190 != &local_180) {
      operator_delete(local_190);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130._M_dataplus._M_p != &local_130.field_2) {
      operator_delete(local_130._M_dataplus._M_p);
    }
    if (local_170 != &local_160) {
      operator_delete(local_170);
    }
    if (local_1b0 != &local_1a0) {
      operator_delete(local_1b0);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != &local_110.field_2) {
      operator_delete(local_110._M_dataplus._M_p);
    }
    if (local_150 != &local_140) {
      operator_delete(local_150);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p);
    }
    local_c0._vptr_Expression = (_func_int **)&PTR_variables_00110c58;
    if (local_c0.m_baseExpressionPtr.
        super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_c0.m_baseExpressionPtr.
                 super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    local_d8._vptr_Expression = (_func_int **)&PTR_variables_00110c58;
    if (local_d8.m_baseExpressionPtr.
        super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_d8.m_baseExpressionPtr.
                 super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    local_a8._vptr_Variable = (_func_int **)&PTR_differentiate_00110c30;
    if (local_a8.m_variableExpressionPtr.
        super___shared_ptr<Kandinsky::VariableExpression,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_a8.m_variableExpressionPtr.
                 super___shared_ptr<Kandinsky::VariableExpression,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    local_f0._vptr_Variable = (_func_int **)&PTR_differentiate_00110c30;
    if (local_f0.m_variableExpressionPtr.
        super___shared_ptr<Kandinsky::VariableExpression,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_f0.m_variableExpressionPtr.
                 super___shared_ptr<Kandinsky::VariableExpression,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    return 0;
  }
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cerr,(char *)local_70,local_68);
  std::endl<char,std::char_traits<char>>(poVar4);
LAB_00108cee:
  exit(1);
}

Assistant:

int main (int /*argc*/, char** /*argv*/)
{
    Variable x;
    Variable y;
    x.setValue(3);
    y.setValue(2);
    assertOrExit((x * (x + y)).evaluate() == 15, std::to_string(x.evaluate()) + " * (" + std::to_string(x.evaluate()) + " + " + std::to_string(y.evaluate()) + ") != 15");
    assertOrExit((x * x + y).evaluate() == 11, std::to_string(x.evaluate()) + " * " + std::to_string(x.evaluate()) + " + " + std::to_string(y.evaluate()) + " != 11");

    return 0;
}